

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::~cmDependsC(cmDependsC *this)

{
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_0085b2f0;
  WriteCacheFile(this);
  std::__cxx11::string::~string((string *)&this->CacheFileName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->HeaderLocationCache)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines>_>_>
  ::~_Rb_tree(&(this->FileCache)._M_t);
  std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::~deque
            (&(this->Unscanned).c);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->Encountered)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->TransformRules)._M_t);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexTransform);
  std::__cxx11::string::~string((string *)&this->IncludeRegexTransformString);
  std::__cxx11::string::~string((string *)&this->IncludeRegexComplainString);
  std::__cxx11::string::~string((string *)&this->IncludeRegexScanString);
  std::__cxx11::string::~string((string *)&this->IncludeRegexLineString);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexComplain);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexScan);
  cmsys::RegularExpression::~RegularExpression(&this->IncludeRegexLine);
  cmDepends::~cmDepends(&this->super_cmDepends);
  return;
}

Assistant:

cmDependsC::~cmDependsC()
{
  this->WriteCacheFile();
}